

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm.cpp
# Opt level: O1

int __thiscall ncnn::RMSNorm::forward_inplace(RMSNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  
  iVar2 = bottom_top_blob->dims;
  if (iVar2 == 3) {
    uVar3 = bottom_top_blob->w;
    uVar11 = (ulong)uVar3;
    uVar9 = bottom_top_blob->h;
    uVar5 = bottom_top_blob->c;
    if (this->affine_size == uVar3) {
      if (0 < (int)uVar5) {
        iVar2 = bottom_top_blob->w;
        pvVar13 = bottom_top_blob->data;
        sVar7 = bottom_top_blob->elemsize;
        iVar4 = this->affine;
        sVar8 = bottom_top_blob->cstep;
        uVar16 = 0;
        do {
          if (0 < (int)uVar9) {
            pvVar6 = (this->gamma_data).data;
            uVar17 = 0;
            pvVar15 = pvVar13;
            do {
              fVar18 = 0.0;
              if (0 < (int)uVar3) {
                uVar14 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar15 + uVar14 * 4);
                  fVar18 = fVar18 + fVar1 * fVar1;
                  uVar14 = uVar14 + 1;
                } while (uVar11 != uVar14);
              }
              fVar18 = 1.0 / SQRT(fVar18 * (1.0 / (float)(int)uVar3) + this->eps);
              if (iVar4 == 0) {
                if (0 < (int)uVar3) {
                  uVar14 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar14 * 4) =
                         *(float *)((long)pvVar15 + uVar14 * 4) * fVar18;
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                }
              }
              else if (0 < (int)uVar3) {
                uVar14 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar14 * 4) =
                       *(float *)((long)pvVar15 + uVar14 * 4) * fVar18 *
                       *(float *)((long)pvVar6 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar11 != uVar14);
              }
              uVar17 = uVar17 + 1;
              pvVar15 = (void *)((long)pvVar15 + (long)iVar2 * sVar7);
            } while (uVar17 != uVar9);
          }
          uVar16 = uVar16 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar8 * sVar7);
        } while (uVar16 != uVar5);
      }
    }
    else if (0 < (int)uVar5) {
      uVar9 = uVar9 * uVar3;
      pvVar13 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->cstep;
      iVar2 = this->affine;
      pvVar6 = (this->gamma_data).data;
      uVar16 = (ulong)uVar9;
      sVar8 = bottom_top_blob->elemsize;
      uVar11 = 0;
      do {
        fVar18 = 0.0;
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            fVar1 = *(float *)((long)pvVar13 + uVar17 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        fVar18 = 1.0 / SQRT(fVar18 * (1.0 / (float)(int)uVar9) + this->eps);
        if (iVar2 == 0) {
          if (0 < (int)uVar9) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar13 + uVar17 * 4) * fVar18;
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
          }
        }
        else if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar13 + uVar17 * 4) * fVar18 *
                 *(float *)((long)pvVar6 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        uVar11 = uVar11 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
      } while (uVar11 != uVar5);
    }
  }
  else if (iVar2 == 2) {
    iVar2 = bottom_top_blob->h;
    if (0 < (long)iVar2) {
      uVar3 = bottom_top_blob->w;
      pvVar13 = bottom_top_blob->data;
      iVar4 = this->affine;
      pvVar6 = (this->gamma_data).data;
      uVar11 = (ulong)uVar3;
      sVar7 = bottom_top_blob->elemsize;
      lVar10 = 0;
      do {
        fVar18 = 0.0;
        if (0 < (int)uVar3) {
          uVar16 = 0;
          do {
            fVar1 = *(float *)((long)pvVar13 + uVar16 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
            uVar16 = uVar16 + 1;
          } while (uVar11 != uVar16);
        }
        fVar18 = 1.0 / SQRT(fVar18 * (1.0 / (float)(int)uVar3) + this->eps);
        if (iVar4 == 0) {
          if (0 < (int)uVar3) {
            uVar16 = 0;
            do {
              *(float *)((long)pvVar13 + uVar16 * 4) =
                   *(float *)((long)pvVar13 + uVar16 * 4) * fVar18;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
        }
        else if (0 < (int)uVar3) {
          uVar16 = 0;
          do {
            *(float *)((long)pvVar13 + uVar16 * 4) =
                 *(float *)((long)pvVar13 + uVar16 * 4) * fVar18 *
                 *(float *)((long)pvVar6 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar11 != uVar16);
        }
        lVar10 = lVar10 + 1;
        pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar3 * sVar7);
      } while (lVar10 != iVar2);
    }
  }
  else if (iVar2 == 1) {
    iVar2 = bottom_top_blob->w;
    lVar10 = (long)iVar2;
    pvVar13 = bottom_top_blob->data;
    fVar18 = 0.0;
    if (0 < lVar10) {
      lVar12 = 0;
      do {
        fVar1 = *(float *)((long)pvVar13 + lVar12 * 4);
        fVar18 = fVar18 + fVar1 * fVar1;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    fVar18 = 1.0 / SQRT(fVar18 / (float)iVar2 + this->eps);
    if (this->affine == 0) {
      if (0 < iVar2) {
        lVar12 = 0;
        do {
          *(float *)((long)pvVar13 + lVar12 * 4) = *(float *)((long)pvVar13 + lVar12 * 4) * fVar18;
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
    }
    else if (0 < iVar2) {
      pvVar6 = (this->gamma_data).data;
      lVar12 = 0;
      do {
        *(float *)((long)pvVar13 + lVar12 * 4) =
             *(float *)((long)pvVar13 + lVar12 * 4) * fVar18 * *(float *)((long)pvVar6 + lVar12 * 4)
        ;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
  }
  return 0;
}

Assistant:

int RMSNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = x / sqrt(rms + eps) * gamma

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sqsum += ptr[i] * ptr[i];
        }
        float rms = sqrtf(sqsum / w + eps);

        float a = 1.f / rms;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a) * gamma_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sqsum += ptr[j] * ptr[j];
            }
            float rms = sqrtf(sqsum / w + eps);

            float a = 1.f / rms;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a) * gamma_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sqsum += ptr[j] * ptr[j];
                    }
                    float rms = sqrtf(sqsum / w + eps);

                    float a = 1.f / rms;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a) * gamma_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sqsum += ptr[i] * ptr[i];
                }
                float rms = sqrtf(sqsum / size + eps);

                float a = 1.f / rms;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a) * gamma_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a;
                    }
                }
            }
        }
    }

    return 0;
}